

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::on_receive_data
          (peer_connection *this,error_code *error,size_t bytes_transferred)

{
  undefined2 uVar1;
  time_point reference;
  ulong uVar2;
  bool bVar3;
  bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void> f;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  time_point new_value;
  int *piVar8;
  size_t sVar9;
  char *data;
  element_type *this_00;
  value_type *this_01;
  error_code *ec_00;
  error_code *ec_01;
  span<char> sVar10;
  byte local_202;
  bool local_201;
  bool local_1f9;
  char *local_1f8;
  undefined1 local_168 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  int buffer_size_limit;
  int force_shrink;
  int sub_transferred;
  int bytes;
  bool prev_choked;
  error_code local_130;
  byte local_119;
  string local_118;
  mutable_buffer local_f8;
  size_t local_e8;
  size_t bytes_1;
  span<char> vec;
  int quota_left;
  undefined1 local_c0 [4];
  int buffer_size;
  error_code ec;
  bool grow_buffer;
  undefined1 local_98 [8];
  cork _c;
  shared_ptr<libtorrent::aux::peer_connection> me;
  string local_60;
  string local_40;
  ulong local_20;
  size_t bytes_transferred_local;
  error_code *error_local;
  peer_connection *this_local;
  
  local_20 = bytes_transferred;
  bytes_transferred_local = (size_t)error;
  error_local = (error_code *)this;
  bVar3 = should_log(this,incoming);
  uVar2 = local_20;
  if (bVar3) {
    print_error_abi_cxx11_(&local_40,(libtorrent *)bytes_transferred_local,ec_00);
    uVar7 = ::std::__cxx11::string::c_str();
    peer_log(this,incoming,"ON_RECEIVE_DATA","bytes: %d %s",uVar2 & 0xffffffff,uVar7);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  counters::inc_stats_counter(this->m_counters,0x39,1);
  bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)bytes_transferred_local);
  if (bVar3) {
    bVar3 = should_log(this,info);
    if (bVar3) {
      print_error_abi_cxx11_(&local_60,(libtorrent *)bytes_transferred_local,ec_01);
      uVar7 = ::std::__cxx11::string::c_str();
      peer_log(this,info,"ERROR","in peer_connection::on_receive_data_impl %s",uVar7);
      ::std::__cxx11::string::~string((string *)&local_60);
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x30])
              (this,bytes_transferred_local,local_20);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
              (this,bytes_transferred_local,0xb,0);
    return;
  }
  reference.__d.__r = (duration)(this->m_connect).__d.__r;
  new_value = time_now();
  relative_time::set(&this->m_last_receive,reference,new_value);
  (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)._vptr_session_logger
    [0x1f])();
  self((peer_connection *)&_c.m_need_uncork);
  cork::cork((cork *)local_98,this);
  iVar5 = (int)local_20;
  iVar4 = receive_buffer::max_receive(&this->m_recv_buffer);
  account_received_bytes(this,(int)local_20);
  if (0 < this->m_extension_outstanding_bytes) {
    ec.cat_._4_4_ = (int)local_20;
    piVar8 = ::std::min<int>(&this->m_extension_outstanding_bytes,(int *)((long)&ec.cat_ + 4));
    this->m_extension_outstanding_bytes = this->m_extension_outstanding_bytes - *piVar8;
  }
  check_graceful_pause(this);
  if (((this->super_peer_connection_hot_members).field_0x28 & 1) == 0) {
    if (iVar5 == iVar4) {
      boost::system::error_code::error_code((error_code *)local_c0);
      sVar9 = polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              ::available(&this->m_socket,(error_code *)local_c0);
      quota_left = (int)sVar9;
      bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)local_c0);
      if (bVar3) {
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_c0,0xe,0);
        ec.cat_._0_4_ = 1;
        goto LAB_0045676a;
      }
      peer_log(this,incoming,"AVAILABLE","%d bytes",sVar9 & 0xffffffff);
      request_bandwidth(this,1,quota_left);
      vec.m_len._4_4_ = this->m_quota[1];
      if (vec.m_len._4_4_ < quota_left) {
        quota_left = vec.m_len._4_4_;
      }
      if (0 < quota_left) {
        sVar10 = receive_buffer::reserve(&this->m_recv_buffer,quota_left);
        vec.m_ptr = (char *)sVar10.m_len;
        bytes_1 = (size_t)sVar10.m_ptr;
        data = span<char>::data((span<char> *)&bytes_1);
        sVar9 = span<char>::size((span<char> *)&bytes_1);
        boost::asio::mutable_buffer::mutable_buffer(&local_f8,data,sVar9);
        local_e8 = polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                   ::read_some<boost::asio::mutable_buffer>
                             (&this->m_socket,&local_f8,(error_code *)local_c0);
        if ((local_e8 == 0) &&
           (bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)local_c0), !bVar3
           )) {
          boost::system::error_code::operator=((error_code *)local_c0,eof);
        }
        bVar3 = should_log(this,incoming);
        sVar9 = local_e8;
        if (bVar3) {
          bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)local_c0);
          local_119 = 0;
          if (bVar3) {
            boost::system::error_code::message_abi_cxx11_(&local_118,(error_code *)local_c0);
            local_119 = 1;
            local_1f8 = (char *)::std::__cxx11::string::c_str();
          }
          else {
            local_1f8 = "";
          }
          peer_log(this,incoming,"SYNC_READ","max: %d ret: %d e: %s",(ulong)(uint)quota_left,
                   sVar9 & 0xffffffff,local_1f8);
          if ((local_119 & 1) != 0) {
            ::std::__cxx11::string::~string((string *)&local_118);
          }
        }
        bVar3 = boost::system::error_code::operator_cast_to_bool((error_code *)local_c0);
        if (bVar3) {
          boost::system::error_code::error_code<boost::asio::error::basic_errors>
                    (&local_130,try_again,(type *)0x0);
          bVar3 = boost::system::operator!=((error_code *)local_c0,&local_130);
          local_1f9 = false;
          if (bVar3) {
            boost::system::error_code::error_code<boost::asio::error::basic_errors>
                      ((error_code *)&bytes,try_again,(type *)0x0);
            local_1f9 = boost::system::operator!=((error_code *)local_c0,(error_code *)&bytes);
          }
          if (local_1f9 != false) {
            (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_c0,0xb,0);
            ec.cat_._0_4_ = 1;
            goto LAB_0045676a;
          }
        }
        else {
          account_received_bytes(this,(int)local_e8);
          local_20 = local_e8 + local_20;
        }
      }
    }
    uVar1 = *(undefined2 *)&this->field_0x885;
    force_shrink = (int)local_20;
    do {
      iVar5 = receive_buffer::advance_pos(&this->m_recv_buffer,force_shrink);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x30])
                (this,bytes_transferred_local,(long)iVar5);
      force_shrink = force_shrink - iVar5;
      if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) {
        ec.cat_._0_4_ = 1;
        goto LAB_0045676a;
      }
      local_201 = 0 < force_shrink && 0 < iVar5;
    } while (local_201);
    local_202 = 0;
    if (*(short *)&this->field_0x885 < 0) {
      local_202 = (byte)((ushort)uVar1 >> 0xf) ^ 0xff;
    }
    iVar5 = 0;
    if ((local_202 & 1) != 0) {
      iVar5 = 100;
    }
    receive_buffer::normalize(&this->m_recv_buffer,iVar5);
    iVar5 = receive_buffer::max_receive(&this->m_recv_buffer);
    if (iVar5 == 0) {
      t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x403d)
      ;
      receive_buffer::grow
                (&this->m_recv_buffer,
                 t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_);
      uVar6 = receive_buffer::capacity(&this->m_recv_buffer);
      peer_log(this,incoming,"GROW_BUFFER","%d bytes",(ulong)uVar6);
    }
    bVar3 = is_seed(this);
    if (bVar3) {
      ::std::weak_ptr<libtorrent::aux::torrent>::lock
                ((weak_ptr<libtorrent::aux::torrent> *)local_168);
      bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_168);
      if (bVar3) {
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_168);
        torrent::seen_complete(this_00);
      }
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)local_168);
    }
    f = libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>
        ::operator~(&v1_2::peer_info::bw_network);
    this_01 = container_wrapper<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_long,_std::array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>_>
              ::operator[](&this->m_channel_state,1);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>::
    operator&=(this_01,f);
    setup_receive(this);
    if ((*(ushort *)&this->field_0x885 >> 0xd & 1) != 0) {
      this->field_0x886 = this->field_0x886 & 0xdf;
      send_block_requests_impl(this);
    }
    ec.cat_._0_4_ = 0;
  }
  else {
    ec.cat_._0_4_ = 1;
  }
LAB_0045676a:
  cork::~cork((cork *)local_98);
  ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::peer_connection> *)&_c.m_need_uncork);
  return;
}

Assistant:

void peer_connection::on_receive_data(error_code const& error
		, std::size_t bytes_transferred)
	{
		TORRENT_ASSERT(is_single_thread());
		COMPLETE_ASYNC("peer_connection::on_receive_data");

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming))
		{
			peer_log(peer_log_alert::incoming, "ON_RECEIVE_DATA"
				, "bytes: %d %s"
				, int(bytes_transferred), print_error(error).c_str());
		}
#endif

		// leave this bit set until we're done looping, reading from the socket.
		// that way we don't trigger any async read calls until the end of this
		// function.
		TORRENT_ASSERT(m_channel_state[download_channel] & peer_info::bw_network);

		TORRENT_ASSERT(bytes_transferred > 0 || error);

		m_counters.inc_stats_counter(counters::on_read_counter);

		INVARIANT_CHECK;

		if (error)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "ERROR"
					, "in peer_connection::on_receive_data_impl %s"
					, print_error(error).c_str());
			}
#endif
			on_receive(error, bytes_transferred);
			disconnect(error, operation_t::sock_read);
			return;
		}

		m_last_receive.set(m_connect, aux::time_now());

		// submit all disk jobs later
		m_ses.deferred_submit_jobs();

		// keep ourselves alive in until this function exits in
		// case we disconnect
		// this needs to be created before the invariant check,
		// to keep the object alive through the exit check
		std::shared_ptr<peer_connection> me(self());

		TORRENT_ASSERT(bytes_transferred > 0);

		// flush the send buffer at the end of this function
		cork _c(*this);

		// if we received exactly as many bytes as we provided a receive buffer
		// for. There most likely are more bytes to read, and we should grow our
		// receive buffer.
		TORRENT_ASSERT(int(bytes_transferred) <= m_recv_buffer.max_receive());
		bool const grow_buffer = (int(bytes_transferred) == m_recv_buffer.max_receive());
		account_received_bytes(int(bytes_transferred));

		if (m_extension_outstanding_bytes > 0)
			m_extension_outstanding_bytes -= std::min(m_extension_outstanding_bytes, int(bytes_transferred));

		check_graceful_pause();
		if (m_disconnecting) return;

		// this is the case where we try to grow the receive buffer and try to
		// drain the socket
		if (grow_buffer)
		{
			error_code ec;
			int buffer_size = int(m_socket.available(ec));
			if (ec)
			{
				disconnect(ec, operation_t::available);
				return;
			}

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming, "AVAILABLE"
				, "%d bytes", buffer_size);
#endif

			request_bandwidth(download_channel, buffer_size);

			int const quota_left = m_quota[download_channel];
			if (buffer_size > quota_left) buffer_size = quota_left;
			if (buffer_size > 0)
			{
				span<char> const vec = m_recv_buffer.reserve(buffer_size);
				std::size_t const bytes = m_socket.read_some(
					boost::asio::mutable_buffer(vec.data(), std::size_t(vec.size())), ec);

				// this is weird. You would imagine read_some() would do this
				if (bytes == 0 && !ec) ec = boost::asio::error::eof;

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log(peer_log_alert::incoming))
				{
					peer_log(peer_log_alert::incoming, "SYNC_READ", "max: %d ret: %d e: %s"
						, buffer_size, int(bytes), ec ? ec.message().c_str() : "");
				}
#endif

				TORRENT_ASSERT(bytes > 0 || ec);
				if (ec)
				{
					if (ec != boost::asio::error::would_block
						&& ec != boost::asio::error::try_again)
					{
						disconnect(ec, operation_t::sock_read);
						return;
					}
				}
				else
				{
					account_received_bytes(int(bytes));
					bytes_transferred += bytes;
				}
			}
		}

		// feed bytes in receive buffer to upper layer by calling on_receive()

		bool const prev_choked = m_peer_choked;
		int bytes = int(bytes_transferred);
		int sub_transferred = 0;
		do {
			sub_transferred = m_recv_buffer.advance_pos(bytes);
			TORRENT_ASSERT(sub_transferred > 0);
			on_receive(error, std::size_t(sub_transferred));
			bytes -= sub_transferred;
			if (m_disconnecting) return;
		} while (bytes > 0 && sub_transferred > 0);

		// if the peer went from unchoked to choked, suggest to the receive
		// buffer that it shrinks to 100 bytes
		int const force_shrink = (m_peer_choked && !prev_choked)
			? 100 : 0;
		m_recv_buffer.normalize(force_shrink);

		if (m_recv_buffer.max_receive() == 0)
		{
			// the message we're receiving is larger than our receive
			// buffer, we must grow.
			int const buffer_size_limit
				= m_settings.get_int(settings_pack::max_peer_recv_buffer_size);
			m_recv_buffer.grow(buffer_size_limit);
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming, "GROW_BUFFER", "%d bytes"
				, m_recv_buffer.capacity());
#endif
		}

		TORRENT_ASSERT(m_recv_buffer.pos_at_end());
		TORRENT_ASSERT(m_recv_buffer.packet_size() > 0);

		if (is_seed())
		{
			auto t = m_torrent.lock();
			if (t) t->seen_complete();
		}

		// allow reading from the socket again
		TORRENT_ASSERT(m_channel_state[download_channel] & peer_info::bw_network);
		m_channel_state[download_channel] &= ~peer_info::bw_network;

		setup_receive();

		if (m_deferred_send_block_requests)
		{
			m_deferred_send_block_requests = false;
			send_block_requests_impl();
		}
	}